

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  bool bVar1;
  char *local_68;
  size_t local_60;
  size_t local_58;
  gnode_t *symbol;
  char *identifier;
  size_t i;
  size_t n;
  gnode_t *target;
  gnode_t *globals;
  gnode_r *decls;
  gnode_file_expr_t *node_local;
  gvisitor_t *self_local;
  
  if (**self->data == 0) {
    local_58 = 0;
  }
  else {
    local_58 = *(size_t *)(*self->data)[2];
  }
  n = local_58;
  if (node->identifiers == (cstring_r *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = node->identifiers->n;
  }
  if (local_60 != 0) {
    bVar1 = false;
    while( true ) {
      if (bVar1) {
        return;
      }
      if (node->identifiers->n == 0) {
        local_68 = (char *)0x0;
      }
      else {
        local_68 = *node->identifiers->p;
      }
      n = (size_t)lookup_node((gnode_t *)n,local_68);
      if ((gnode_t *)n == (gnode_t *)0x0) break;
      (node->location).type = LOCATION_GLOBAL;
      (node->location).index = 0;
      (node->location).nup = 0;
      bVar1 = true;
    }
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Module identifier %s not found.",local_68)
    ;
    return;
  }
  __assert_fail("n",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                ,0x47e,"void visit_file_expr(gvisitor_t *, gnode_file_expr_t *)");
}

Assistant:

static void visit_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    DEBUG_CODEGEN("visit_file_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    size_t count = gnode_array_size(node->identifiers);
    for (size_t i=0; i<count; ++i) {
        const char *identifier = gnode_array_get(node->identifiers, i);
        uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));

        if ((is_assignment) && (IS_LAST_LOOP(i, count))) {
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid file expression.");
			ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
        }
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}